

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeLockTable(Btree *p,int iTab,u8 isWriteLock)

{
  int *piVar1;
  sqlite3_mutex *psVar2;
  BtShared *pBVar3;
  int iVar4;
  BtLock *pBVar5;
  byte bVar6;
  byte eLock;
  
  if (p->sharable == '\0') {
    iVar4 = 0;
  }
  else {
    eLock = isWriteLock + 1;
    sqlite3BtreeEnter(p);
    iVar4 = querySharedCacheTableLock(p,iTab,eLock);
    if (iVar4 == 0) {
      pBVar3 = p->pBt;
      for (pBVar5 = pBVar3->pLock; pBVar5 != (BtLock *)0x0; pBVar5 = pBVar5->pNext) {
        if ((pBVar5->iTable == iTab) && (pBVar5->pBtree == p)) {
          bVar6 = pBVar5->eLock;
          goto LAB_00141b01;
        }
      }
      pBVar5 = (BtLock *)sqlite3Malloc(0x18);
      if (pBVar5 == (BtLock *)0x0) {
        iVar4 = 7;
      }
      else {
        *(undefined4 *)((long)&pBVar5->pNext + 4) = 0;
        *(undefined8 *)&pBVar5->eLock = 0;
        pBVar5->iTable = iTab;
        pBVar5->pBtree = p;
        pBVar5->pNext = pBVar3->pLock;
        pBVar3->pLock = pBVar5;
        bVar6 = 0;
LAB_00141b01:
        iVar4 = 0;
        if (bVar6 < eLock) {
          pBVar5->eLock = eLock;
        }
      }
    }
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        psVar2 = p->pBt->mutex;
        if (psVar2 != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(psVar2);
        }
        p->locked = '\0';
      }
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeLockTable(Btree *p, int iTab, u8 isWriteLock){
  int rc = SQLITE_OK;
  assert( p->inTrans!=TRANS_NONE );
  if( p->sharable ){
    u8 lockType = READ_LOCK + isWriteLock;
    assert( READ_LOCK+1==WRITE_LOCK );
    assert( isWriteLock==0 || isWriteLock==1 );

    sqlite3BtreeEnter(p);
    rc = querySharedCacheTableLock(p, iTab, lockType);
    if( rc==SQLITE_OK ){
      rc = setSharedCacheTableLock(p, iTab, lockType);
    }
    sqlite3BtreeLeave(p);
  }
  return rc;
}